

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * __thiscall
units::probeUnitBase_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  bool numOnly;
  bool numOnly_00;
  unit un_00;
  unit un_01;
  unit un_02;
  unit un_03;
  precise_unit pVar6;
  allocator local_369;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_3;
  double mx;
  size_t cut;
  undefined1 local_258 [8];
  string prefix_3;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  byte local_1e9;
  string local_1e8;
  undefined1 local_1c8 [8];
  string prefix_2;
  string local_1a0;
  unit_data local_17c;
  unit local_178;
  double local_170;
  double dStack_168;
  allocator local_15a;
  byte local_159;
  undefined1 local_158 [8];
  string prefix_1;
  string local_130;
  int local_10c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  byte local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  string prefix;
  undefined1 local_98 [8];
  string fnd;
  unit local_70;
  unit base;
  undefined1 auStack_58 [8];
  precise_unit ext;
  string local_40 [8];
  string beststr;
  pair<units::precise_unit,_const_char_*> *probe_local;
  precise_unit *un_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  
  beststr.field_2._8_8_ = un;
  std::__cxx11::string::string(local_40);
  pVar6 = precise_unit::operator*((precise_unit *)this,(precise_unit *)beststr.field_2._8_8_);
  ext.multiplier_ = pVar6._8_8_;
  auStack_58 = (undefined1  [8])pVar6.multiplier_;
  fnd.field_2._12_4_ = precise_unit::base_units((precise_unit *)auStack_58);
  unit::unit(&local_70,(unit_data *)((long)&fnd.field_2 + 0xc));
  prefix.field_2._8_4_ = local_70.multiplier_;
  prefix.field_2._12_4_ = local_70.base_units_;
  find_unit_abi_cxx11_((string *)local_98,(units *)local_70,un_00);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    dVar1 = precise_unit::multiplier((precise_unit *)auStack_58);
    std::__cxx11::string::string((string *)&local_e0,(string *)local_98);
    generateUnitSequence((string *)local_c0,dVar1,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    local_e1 = 0;
    std::operator+(&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,'/'
                  );
    std::operator+(__return_storage_ptr__,&local_108,*(char **)(beststr.field_2._8_8_ + 0x10));
    std::__cxx11::string::~string((string *)&local_108);
    pcVar4 = (char *)std::__cxx11::string::front();
    bVar2 = isNumericalStartCharacter(*pcVar4);
    if (bVar2) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        uVar3 = std::__cxx11::string::size();
        uVar5 = std::__cxx11::string::size();
        if (uVar3 < uVar5) goto LAB_001ba503;
      }
      else {
LAB_001ba503:
        std::__cxx11::string::operator=(local_40,(string *)__return_storage_ptr__);
      }
      local_10c = 0;
    }
    else {
      local_e1 = 1;
      local_10c = 1;
    }
    if ((local_e1 & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_c0);
    if (local_10c != 0) goto LAB_001baec6;
  }
  prefix_1.field_2._8_8_ = unit::inv(&local_70);
  find_unit_abi_cxx11_(&local_130,(units *)prefix_1.field_2._8_8_,un_01);
  std::__cxx11::string::operator=((string *)local_98,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    dVar1 = precise_unit::multiplier((precise_unit *)auStack_58);
    pcVar4 = (char *)std::__cxx11::string::back();
    bVar2 = isDigitCharacter(*pcVar4);
    getMultiplierString_abi_cxx11_((string *)local_158,(units *)(ulong)bVar2,1.0 / dVar1,numOnly);
    local_159 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"1/(",&local_15a);
    std::allocator<char>::~allocator((allocator<char> *)&local_15a);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_158);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_98);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::front();
      bVar2 = isNumericalStartCharacter(*pcVar4);
      if (!bVar2) goto LAB_001ba6fa;
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        uVar3 = std::__cxx11::string::size();
        uVar5 = std::__cxx11::string::size();
        if (uVar3 < uVar5) goto LAB_001ba782;
      }
      else {
LAB_001ba782:
        std::__cxx11::string::operator=(local_40,(string *)__return_storage_ptr__);
      }
      local_10c = 0;
    }
    else {
LAB_001ba6fa:
      local_159 = 1;
      local_10c = 1;
    }
    if ((local_159 & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_158);
    if (local_10c != 0) goto LAB_001baec6;
  }
  pVar6 = precise_unit::operator/((precise_unit *)this,(precise_unit *)beststr.field_2._8_8_);
  dStack_168 = pVar6._8_8_;
  local_170 = pVar6.multiplier_;
  auStack_58 = (undefined1  [8])local_170;
  ext.multiplier_ = dStack_168;
  local_17c = precise_unit::base_units((precise_unit *)auStack_58);
  unit::unit(&local_178,&local_17c);
  local_70 = local_178;
  prefix_2.field_2._8_4_ = local_178.multiplier_;
  prefix_2.field_2._12_4_ = local_178.base_units_;
  find_unit_abi_cxx11_(&local_1a0,(units *)local_178,un_02);
  std::__cxx11::string::operator=((string *)local_98,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    dVar1 = precise_unit::multiplier((precise_unit *)auStack_58);
    std::__cxx11::string::string((string *)&local_1e8,(string *)local_98);
    generateUnitSequence((string *)local_1c8,dVar1,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    local_1e9 = 0;
    std::operator+(&local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   '*');
    std::operator+(__return_storage_ptr__,&local_210,*(char **)(beststr.field_2._8_8_ + 0x10));
    std::__cxx11::string::~string((string *)&local_210);
    pcVar4 = (char *)std::__cxx11::string::front();
    bVar2 = isNumericalStartCharacter(*pcVar4);
    if (bVar2) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        uVar3 = std::__cxx11::string::size();
        uVar5 = std::__cxx11::string::size();
        if (uVar3 < uVar5) goto LAB_001baa24;
      }
      else {
LAB_001baa24:
        std::__cxx11::string::operator=(local_40,(string *)__return_storage_ptr__);
      }
      local_10c = 0;
    }
    else {
      local_1e9 = 1;
      local_10c = 1;
    }
    if ((local_1e9 & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_1c8);
    if (local_10c != 0) goto LAB_001baec6;
  }
  prefix_3.field_2._8_8_ = unit::inv(&local_70);
  find_unit_abi_cxx11_(&local_230,(units *)prefix_3.field_2._8_8_,un_03);
  std::__cxx11::string::operator=((string *)local_98,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    dVar1 = precise_unit::multiplier((precise_unit *)auStack_58);
    std::__cxx11::string::string((string *)&cut,(string *)local_98);
    generateUnitSequence((string *)local_258,1.0 / dVar1,(string *)&cut);
    std::__cxx11::string::~string((string *)&cut);
    pcVar4 = (char *)std::__cxx11::string::front();
    bVar2 = isNumericalStartCharacter(*pcVar4);
    if (bVar2) {
      mx = 0.0;
      str_3.field_2._8_8_ = getDoubleFromString((string *)local_258,(size_t *)&mx);
      getMultiplierString_abi_cxx11_
                (&local_308,(units *)0x1,1.0 / (double)str_3.field_2._8_8_,numOnly_00);
      std::operator+(&local_2e8,&local_308,*(char **)(beststr.field_2._8_8_ + 0x10));
      std::operator+(&local_2c8,&local_2e8,"/");
      std::__cxx11::string::substr((ulong)&local_328,(ulong)local_258);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                     &local_2c8,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        uVar3 = std::__cxx11::string::size();
        uVar5 = std::__cxx11::string::size();
        if (uVar3 < uVar5) goto LAB_001baca8;
      }
      else {
LAB_001baca8:
        std::__cxx11::string::operator=(local_40,(string *)local_2a8);
      }
      std::__cxx11::string::~string((string *)local_2a8);
      local_10c = 0;
    }
    else {
      pcVar4 = *(char **)(beststr.field_2._8_8_ + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_368,pcVar4,&local_369);
      std::operator+(&local_348,&local_368,"/");
      std::operator+(__return_storage_ptr__,&local_348,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258)
      ;
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      local_10c = 1;
    }
    std::__cxx11::string::~string((string *)local_258);
    if (local_10c != 0) goto LAB_001baec6;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  local_10c = 1;
LAB_001baec6:
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string probeUnitBase(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    std::string beststr;
    // let's try common divisor units on base units
    auto ext = un * probe.first;
    auto base = unit(ext.base_units());
    auto fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);

        auto str = prefix + '/' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try inverse of common multiplier units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = getMultiplierString(
            1.0 / ext.multiplier(), isDigitCharacter(fnd.back()));
        std::string str{"1/("};
        str += prefix;
        str += fnd;
        str.push_back('*');
        str.append(probe.second);
        str.push_back(')');
        if (prefix.empty() || !isNumericalStartCharacter(prefix.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = std::move(str);
        }
    }
    // let's try common multiplier units on base units
    ext = un / probe.first;
    base = unit(ext.base_units());
    fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);
        auto str = prefix + '*' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try common divisor with inv units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(1.0 / ext.multiplier(), fnd);
        if (isNumericalStartCharacter(prefix.front())) {
            size_t cut{0};
            double mx = getDoubleFromString(prefix, &cut);

            auto str = getMultiplierString(1.0 / mx, true) + probe.second +
                "/" + prefix.substr(cut);
            if (beststr.empty() || str.size() < beststr.size()) {
                beststr = str;
            }

        } else {
            return std::string(probe.second) + "/" + prefix;
        }
    }
    return beststr;
}